

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eviction.cpp
# Opt level: O1

void ProtectEvictionCandidatesByRatio
               (vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
                *eviction_candidates)

{
  pointer pNVar1;
  pointer pNVar2;
  __normal_iterator<NodeEvictionCandidate_*,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>_>
  __last;
  function<bool_(const_NodeEvictionCandidate_&)> __pred;
  int iVar3;
  ulong uVar4;
  void *pvVar5;
  _Manager_type p_Var6;
  ulong uVar7;
  __normal_iterator<NodeEvictionCandidate_*,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>_>
  _Var8;
  ulong uVar9;
  _Manager_type p_Var10;
  ulong uVar11;
  long lVar12;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar13;
  size_t delta;
  long lVar14;
  difference_type __n;
  long lVar15;
  ulong uVar16;
  pointer pNVar17;
  ulong unaff_R12;
  _Iter_comp_iter<CompareNodeNetworkTime> __comp;
  void *unaff_R15;
  void *pvVar18;
  long in_FS_OFFSET;
  byte bVar19;
  array<Net,_4UL> networks;
  _Invoker_type p_Var20;
  _Any_data local_d8;
  code *local_c8;
  code *local_c0;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  _Any_data local_98;
  code *local_88;
  undefined8 local_78;
  long alStack_70 [8];
  
  alStack_70[7] = *(long *)(in_FS_OFFSET + 0x28);
  pNVar1 = (eviction_candidates->
           super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pNVar2 = (eviction_candidates->
           super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  uVar11 = ((long)pNVar2 - (long)pNVar1 >> 3) * -0x71c71c71c71c71c7;
  alStack_70[0] = 0;
  alStack_70[2] = 0;
  alStack_70[4] = 0;
  alStack_70[6] = 0;
  local_78 = 0x500000000;
  alStack_70[1] = 0x400000000;
  alStack_70[3] = 0x700000001;
  alStack_70[5] = 0x300000000;
  lVar12 = 0;
  do {
    if (pNVar1 == pNVar2) {
      lVar15 = 0;
    }
    else {
      lVar15 = 0;
      pNVar17 = pNVar1;
      do {
        if (*(char *)((long)alStack_70 + lVar12 + -8) == '\0') {
          bVar19 = pNVar17->m_network == *(Network *)((long)alStack_70 + lVar12 + -4);
        }
        else {
          bVar19 = pNVar17->m_is_local;
        }
        lVar15 = lVar15 + (ulong)bVar19;
        pNVar17 = pNVar17 + 1;
      } while (pNVar17 != pNVar2);
    }
    *(long *)((long)alStack_70 + lVar12) = lVar15;
    lVar12 = lVar12 + 0x10;
  } while (lVar12 != 0x40);
  uVar4 = uVar11 >> 1;
  uVar9 = 2;
  do {
    uVar16 = uVar9;
    if (uVar16 == 0) {
      pvVar18 = (void *)0x0;
      uVar16 = 0;
      break;
    }
    pvVar5 = operator_new(uVar16 << 4,(nothrow_t *)&std::nothrow);
    uVar9 = uVar16;
    pvVar18 = pvVar5;
    if (pvVar5 == (void *)0x0) {
      pvVar18 = unaff_R15;
      if (uVar16 == 1) {
        uVar16 = unaff_R12;
        uVar9 = 0;
      }
      else {
        uVar9 = uVar16 + 1;
        uVar16 = unaff_R12;
        uVar9 = uVar9 >> 1;
      }
    }
    unaff_R12 = uVar16;
    unaff_R15 = pvVar18;
  } while (pvVar5 == (void *)0x0);
  if (pvVar18 == (void *)0x0) {
    uVar16 = 0;
  }
  if (pvVar18 == (void *)0x0) {
    std::
    __insertion_sort<ProtectEvictionCandidatesByRatio(std::vector<NodeEvictionCandidate,std::allocator<NodeEvictionCandidate>>&)::Net*,__gnu_cxx::__ops::_Iter_comp_iter<ProtectEvictionCandidatesByRatio(std::vector<NodeEvictionCandidate,std::allocator<NodeEvictionCandidate>>&)::__3>>
              (&local_78,alStack_70 + 7);
  }
  else {
    std::
    __stable_sort_adaptive<ProtectEvictionCandidatesByRatio(std::vector<NodeEvictionCandidate,std::allocator<NodeEvictionCandidate>>&)::Net*,ProtectEvictionCandidatesByRatio(std::vector<NodeEvictionCandidate,std::allocator<NodeEvictionCandidate>>&)::Net*,long,__gnu_cxx::__ops::_Iter_comp_iter<ProtectEvictionCandidatesByRatio(std::vector<NodeEvictionCandidate,std::allocator<NodeEvictionCandidate>>&)::__3>>
              (&local_78,alStack_70 + 7,pvVar18,uVar16);
  }
  operator_delete(pvVar18,uVar16 << 4);
  p_Var6 = (_Manager_type)(uVar11 >> 2);
  p_Var10 = (_Manager_type)0x0;
  do {
    uVar9 = (long)p_Var6 - (long)p_Var10;
    if (p_Var6 < p_Var10 || uVar9 == 0) break;
    uVar16 = 0;
    lVar12 = 0;
    do {
      uVar16 = (uVar16 + 1) - (ulong)(*(long *)((long)alStack_70 + lVar12) == 0);
      lVar12 = lVar12 + 0x10;
    } while (lVar12 != 0x40);
    if (uVar16 == 0) {
      p_Var20 = (_Invoker_type)0x0;
    }
    else {
      p_Var20 = (_Invoker_type)0x0;
      uVar7 = uVar9 / uVar16;
      if (uVar9 < uVar16) {
        uVar7 = 1;
      }
      lVar12 = 0;
      do {
        if (*(long *)((long)alStack_70 + lVar12) == 0) {
          iVar3 = 7;
        }
        else {
          _Var8._M_current =
               (eviction_candidates->
               super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
               _M_impl.super__Vector_impl_data._M_start;
          __last._M_current =
               (eviction_candidates->
               super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          uVar9 = ((long)__last._M_current - (long)_Var8._M_current >> 3) * -0x71c71c71c71c71c7;
          local_b8._M_unused._0_8_ = (undefined8)((long)alStack_70 + lVar12 + -8);
          local_b8._8_8_ = 0;
          pcStack_a0 = std::
                       _Function_handler<bool_(const_NodeEvictionCandidate_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/eviction.cpp:152:53)>
                       ::_M_invoke;
          local_a8 = std::
                     _Function_handler<bool_(const_NodeEvictionCandidate_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/eviction.cpp:152:53)>
                     ::_M_manager;
          if (__last._M_current != _Var8._M_current) {
            __comp._M_comp =
                 (CompareNodeNetworkTime)
                 ((ulong)*(uint *)((long)alStack_70 + lVar12 + -4) << 0x20 |
                 (ulong)(byte)*local_b8._M_unused._M_function_pointer);
            lVar15 = 0x3f;
            if (uVar9 != 0) {
              for (; uVar9 >> lVar15 == 0; lVar15 = lVar15 + -1) {
              }
            }
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<NodeEvictionCandidate*,std::vector<NodeEvictionCandidate,std::allocator<NodeEvictionCandidate>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<CompareNodeNetworkTime>>
                      (_Var8,__last,(ulong)(((uint)lVar15 ^ 0x3f) * 2) ^ 0x7e,__comp);
            std::
            __final_insertion_sort<__gnu_cxx::__normal_iterator<NodeEvictionCandidate*,std::vector<NodeEvictionCandidate,std::allocator<NodeEvictionCandidate>>>,__gnu_cxx::__ops::_Iter_comp_iter<CompareNodeNetworkTime>>
                      (_Var8,__last,__comp);
          }
          pNVar1 = (eviction_candidates->
                   super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          _Var8._M_current =
               (eviction_candidates->
               super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          std::function<bool_(const_NodeEvictionCandidate_&)>::function
                    ((function<bool_(const_NodeEvictionCandidate_&)> *)&local_98,
                     (function<bool_(const_NodeEvictionCandidate_&)> *)&local_b8);
          uVar16 = ((long)_Var8._M_current - (long)pNVar1 >> 3) * -0x71c71c71c71c71c7;
          if (uVar7 <= uVar16) {
            uVar16 = uVar7;
          }
          __pred.super__Function_base._M_functor._8_8_ = p_Var10;
          __pred.super__Function_base._M_functor._M_unused._M_object = (void *)uVar11;
          __pred.super__Function_base._M_manager = p_Var6;
          __pred._M_invoker = p_Var20;
          _Var8 = std::
                  remove_if<__gnu_cxx::__normal_iterator<NodeEvictionCandidate*,std::vector<NodeEvictionCandidate,std::allocator<NodeEvictionCandidate>>>,std::function<bool(NodeEvictionCandidate_const&)>>
                            (_Var8._M_current + -uVar16,_Var8,__pred);
          if (_Var8._M_current !=
              (eviction_candidates->
              super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
              _M_impl.super__Vector_impl_data._M_finish) {
            (eviction_candidates->
            super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
            _M_impl.super__Vector_impl_data._M_finish = _Var8._M_current;
          }
          uVar13 = extraout_RDX;
          if (local_88 != (code *)0x0) {
            (*local_88)(&local_98,&local_98,__destroy_functor);
            uVar13 = extraout_RDX_00;
          }
          if (local_a8 != (code *)0x0) {
            (*local_a8)(&local_b8,&local_b8,__destroy_functor);
            uVar13 = extraout_RDX_01;
          }
          lVar15 = (long)(eviction_candidates->
                         super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(eviction_candidates->
                         super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 3;
          iVar3 = 0;
          lVar14 = uVar9 + lVar15 * 0x71c71c71c71c71c7;
          if ((ulong)(lVar15 * -0x71c71c71c71c71c7) <= uVar9 && lVar14 != 0) {
            p_Var10 = p_Var10 + lVar14;
            p_Var20 = (_Invoker_type)CONCAT71((int7)((ulong)uVar13 >> 8),1);
            if (p_Var10 < p_Var6) {
              *(long *)((long)alStack_70 + lVar12) = *(long *)((long)alStack_70 + lVar12) - lVar14;
            }
            else {
              iVar3 = 6;
            }
          }
        }
      } while (((iVar3 == 7) || (iVar3 == 0)) && (lVar12 = lVar12 + 0x10, lVar12 != 0x40));
    }
  } while (((ulong)p_Var20 & 1) != 0);
  if (p_Var10 !=
      (_Manager_type)
      (((long)(eviction_candidates->
              super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(eviction_candidates->
              super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
              _M_impl.super__Vector_impl_data._M_start >> 3) * 0x71c71c71c71c71c7 + uVar11)) {
    __assert_fail("num_protected == initial_size - eviction_candidates.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/eviction.cpp"
                  ,0xad,
                  "void ProtectEvictionCandidatesByRatio(std::vector<NodeEvictionCandidate> &)");
  }
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  local_c0 = std::
             _Function_handler<bool_(const_NodeEvictionCandidate_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/eviction.cpp:80:67)>
             ::_M_invoke;
  local_c8 = std::
             _Function_handler<bool_(const_NodeEvictionCandidate_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/eviction.cpp:80:67)>
             ::_M_manager;
  EraseLastKElements<NodeEvictionCandidate,bool(*)(NodeEvictionCandidate_const&,NodeEvictionCandidate_const&)>
            (eviction_candidates,ReverseCompareNodeTimeConnected,uVar4 - (long)p_Var10,
             (function<bool_(const_NodeEvictionCandidate_&)> *)&local_d8);
  if (local_c8 != (code *)0x0) {
    (*local_c8)(&local_d8,&local_d8,__destroy_functor);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != alStack_70[7]) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ProtectEvictionCandidatesByRatio(std::vector<NodeEvictionCandidate>& eviction_candidates)
{
    // Protect the half of the remaining nodes which have been connected the longest.
    // This replicates the non-eviction implicit behavior, and precludes attacks that start later.
    // To favorise the diversity of our peer connections, reserve up to half of these protected
    // spots for Tor/onion, localhost, I2P, and CJDNS peers, even if they're not longest uptime
    // overall. This helps protect these higher-latency peers that tend to be otherwise
    // disadvantaged under our eviction criteria.
    const size_t initial_size = eviction_candidates.size();
    const size_t total_protect_size{initial_size / 2};

    // Disadvantaged networks to protect. In the case of equal counts, earlier array members
    // have the first opportunity to recover unused slots from the previous iteration.
    struct Net { bool is_local; Network id; size_t count; };
    std::array<Net, 4> networks{
        {{false, NET_CJDNS, 0}, {false, NET_I2P, 0}, {/*localhost=*/true, NET_MAX, 0}, {false, NET_ONION, 0}}};

    // Count and store the number of eviction candidates per network.
    for (Net& n : networks) {
        n.count = std::count_if(eviction_candidates.cbegin(), eviction_candidates.cend(),
                                [&n](const NodeEvictionCandidate& c) {
                                    return n.is_local ? c.m_is_local : c.m_network == n.id;
                                });
    }
    // Sort `networks` by ascending candidate count, to give networks having fewer candidates
    // the first opportunity to recover unused protected slots from the previous iteration.
    std::stable_sort(networks.begin(), networks.end(), [](Net a, Net b) { return a.count < b.count; });

    // Protect up to 25% of the eviction candidates by disadvantaged network.
    const size_t max_protect_by_network{total_protect_size / 2};
    size_t num_protected{0};

    while (num_protected < max_protect_by_network) {
        // Count the number of disadvantaged networks from which we have peers to protect.
        auto num_networks = std::count_if(networks.begin(), networks.end(), [](const Net& n) { return n.count; });
        if (num_networks == 0) {
            break;
        }
        const size_t disadvantaged_to_protect{max_protect_by_network - num_protected};
        const size_t protect_per_network{std::max(disadvantaged_to_protect / num_networks, static_cast<size_t>(1))};
        // Early exit flag if there are no remaining candidates by disadvantaged network.
        bool protected_at_least_one{false};

        for (Net& n : networks) {
            if (n.count == 0) continue;
            const size_t before = eviction_candidates.size();
            EraseLastKElements(eviction_candidates, CompareNodeNetworkTime(n.is_local, n.id),
                               protect_per_network, [&n](const NodeEvictionCandidate& c) {
                                   return n.is_local ? c.m_is_local : c.m_network == n.id;
                               });
            const size_t after = eviction_candidates.size();
            if (before > after) {
                protected_at_least_one = true;
                const size_t delta{before - after};
                num_protected += delta;
                if (num_protected >= max_protect_by_network) {
                    break;
                }
                n.count -= delta;
            }
        }
        if (!protected_at_least_one) {
            break;
        }
    }

    // Calculate how many we removed, and update our total number of peers that
    // we want to protect based on uptime accordingly.
    assert(num_protected == initial_size - eviction_candidates.size());
    const size_t remaining_to_protect{total_protect_size - num_protected};
    EraseLastKElements(eviction_candidates, ReverseCompareNodeTimeConnected, remaining_to_protect);
}